

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O2

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::toCCDF(Distributions *this,vector<double,_std::allocator<double>_> *distribution)

{
  pointer pdVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar3;
  uint uVar4;
  long lVar5;
  size_type __n;
  allocator_type local_49;
  value_type local_48;
  double local_40;
  value_type_conflict4 local_38;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_49);
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    local_48 = pdVar1[lVar5 + -1];
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,lVar5 - 1);
    *pvVar3 = local_48;
    iVar2 = (int)((ulong)((long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    __n = (size_type)(iVar2 - 1);
    for (uVar4 = iVar2 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      local_48 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
      local_40 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)uVar4);
      *pvVar3 = local_48 + local_40;
      __n = __n - 1;
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(distribution.size()-1) = distribution[distribution.size()-1];
	for (int i=distribution.size()-2; i>=0; --i) {
		result->at(i) = distribution[i] + result->at(i+1);
	}
	return result;
}